

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMan.c
# Opt level: O2

Hop_Man_t * Hop_ManStart(void)

{
  undefined1 *puVar1;
  Hop_Man_t *p;
  Vec_Ptr_t *pVVar2;
  Hop_Obj_t **ppHVar3;
  int iVar4;
  Hop_Obj_t *Entry;
  
  iVar4 = 1;
  p = (Hop_Man_t *)calloc(1,0xb8);
  p->nTravIds = 1;
  p->fRefCount = 1;
  pVVar2 = Vec_PtrAlloc(iVar4);
  p->vPis = pVVar2;
  pVVar2 = Vec_PtrAlloc(iVar4);
  p->vPos = pVVar2;
  Hop_ManStartMemory(p);
  Entry = p->pListFree;
  if (Entry == (Hop_Obj_t *)0x0) {
    Hop_ManAddMemory(p);
    Entry = p->pListFree;
  }
  p->pListFree = (Hop_Obj_t *)Entry->field_0;
  *(undefined8 *)&Entry->field_0x20 = 0;
  Entry->pFanin0 = (Hop_Obj_t *)0x0;
  Entry->pFanin1 = (Hop_Obj_t *)0x0;
  (Entry->field_0).pData = (void *)0x0;
  (Entry->field_1).pNext = (Hop_Obj_t *)0x0;
  pVVar2 = p->vObjs;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (p->nCreated != pVVar2->nSize) {
      __assert_fail("p->nCreated == Vec_PtrSize(p->vObjs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hop.h"
                    ,0xf0,"Hop_Obj_t *Hop_ManFetchMemory(Hop_Man_t *)");
    }
    Vec_PtrPush(pVVar2,Entry);
  }
  iVar4 = p->nCreated;
  p->nCreated = iVar4 + 1;
  Entry->Id = iVar4;
  p->pConst1 = Entry;
  *(uint *)&Entry->field_0x20 = (*(uint *)&Entry->field_0x20 & 0xfffffff8) + 1;
  puVar1 = &p->pConst1->field_0x20;
  *(uint *)puVar1 = *(uint *)puVar1 | 8;
  p->nCreated = 1;
  p->nTableSize = 0x2717;
  ppHVar3 = (Hop_Obj_t **)calloc(1,0x138b8);
  p->pTable = ppHVar3;
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Hop_Man_t * Hop_ManStart()
{
    Hop_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Hop_Man_t, 1 );
    memset( p, 0, sizeof(Hop_Man_t) );
    // perform initializations
    p->nTravIds = 1;
    p->fRefCount = 1;
    p->fCatchExor = 0;
    // allocate arrays for nodes
    p->vPis = Vec_PtrAlloc( 100 );
    p->vPos = Vec_PtrAlloc( 100 );
    // prepare the internal memory manager
    Hop_ManStartMemory( p );
    // create the constant node
    p->pConst1 = Hop_ManFetchMemory( p );
    p->pConst1->Type = AIG_CONST1;
    p->pConst1->fPhase = 1;
    p->nCreated = 1;
    // start the table
//    p->nTableSize = 107;
    p->nTableSize = 10007;
    p->pTable = ABC_ALLOC( Hop_Obj_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Hop_Obj_t *) * p->nTableSize );
    return p;
}